

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.hpp
# Opt level: O1

void __thiscall tf::Topology::_carry_out_promise(Topology *this)

{
  exception_ptr e;
  exception_ptr local_28;
  void *local_20;
  long local_18;
  void *local_10;
  
  local_20 = (this->_exception_ptr)._M_exception_object;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
    local_18 = 0;
    local_10 = (this->_exception_ptr)._M_exception_object;
    (this->_exception_ptr)._M_exception_object = (void *)0x0;
    if (local_10 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_18 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    local_28._M_exception_object = local_20;
    if (local_20 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    std::promise<void>::set_exception(&this->_promise,&local_28);
    if (local_28._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_20 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    return;
  }
  std::promise<void>::set_value(&this->_promise);
  return;
}

Assistant:

inline void Topology::_carry_out_promise() {
  if(_exception_ptr) {
    auto e = _exception_ptr;
    _exception_ptr = nullptr;
    _promise.set_exception(e);
  }
  else {
    _promise.set_value();
  }
}